

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_Expression_x_iutest_x_Logical_Test::Body(iu_Expression_x_iutest_x_Logical_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_580;
  AssertionHelper local_560;
  Fixed local_530;
  bool local_3a5;
  int local_3a4;
  int local_3a0;
  ExpressionDecomposer local_399;
  ExpressionLHS<int> local_398;
  ExpressionResult local_370;
  ExpressionResult local_348;
  AssertionResult local_320;
  undefined1 local_2f8 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_2b0;
  Fixed local_280;
  bool local_f5 [17];
  int local_e4;
  int local_e0;
  ExpressionDecomposer local_d9;
  ExpressionLHS<int> local_d8;
  ExpressionResult local_b0;
  ExpressionResult local_88;
  AssertionResult local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Expression_x_iutest_x_Logical_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_e0 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_d8,&local_d9,&local_e0);
  local_e4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==(&local_b0,&local_d8,&local_e4);
  local_f5[0] = g();
  local_f5[0] = !local_f5[0];
  iutest::detail::ExpressionResult::operator&&(&local_88,&local_b0,local_f5);
  iutest::detail::ExpressionResult::GetResult(&local_60,&local_88,true);
  iutest::AssertionResult::Is((AssertionResult *)local_38,&local_60);
  iutest::AssertionResult::~AssertionResult(&local_60);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_88);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_b0);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_280,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_280);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_1.m_result,(internal *)local_38,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() == 42 && g() == false))","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x4e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_2b0,&local_280);
    iutest::AssertionHelper::~AssertionHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_280);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_3a0 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_398,&local_399,&local_3a0);
  local_3a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_370,&local_398,&local_3a4);
  local_3a5 = g();
  local_3a5 = !local_3a5;
  iutest::detail::ExpressionResult::operator||(&local_348,&local_370,&local_3a5);
  iutest::detail::ExpressionResult::GetResult(&local_320,&local_348,true);
  iutest::AssertionResult::Is((AssertionResult *)local_2f8,&local_320);
  iutest::AssertionResult::~AssertionResult(&local_320);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_348);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_370);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_398);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    memset(&local_530,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_530);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_580,(internal *)local_2f8,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || g() == false))","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x4f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_560,&local_530);
    iutest::AssertionHelper::~AssertionHelper(&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    iutest::AssertionHelper::Fixed::~Fixed(&local_530);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  return;
}

Assistant:

IUTEST(Expression, Logical)
{
    IUTEST_EXPECT(f() == 42 && g() == false );
    IUTEST_EXPECT(f() != 42 || g() == false );
}